

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

void __thiscall spirv_cross::ParsedIR::fixup_reserved_names(ParsedIR *this)

{
  size_t sVar1;
  undefined8 in_RAX;
  mapped_type *name;
  long lVar2;
  Decoration *memb;
  Decoration *name_00;
  _Hash_node_base *p_Var3;
  undefined8 uStack_38;
  
  p_Var3 = (this->meta_needing_name_fixup)._M_h._M_before_begin._M_nxt;
  uStack_38 = in_RAX;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      uStack_38 = CONCAT44(*(undefined4 *)&p_Var3[1]._M_nxt,(undefined4)uStack_38);
      name = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->meta,(key_type *)((long)&uStack_38 + 4));
      sanitize_identifier((string *)name,false,false);
      sVar1 = (name->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
      if (sVar1 != 0) {
        name_00 = (name->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
        lVar2 = sVar1 * 0x160;
        do {
          sanitize_identifier(&name_00->alias,true,false);
          name_00 = name_00 + 1;
          lVar2 = lVar2 + -0x160;
        } while (lVar2 != 0);
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->meta_needing_name_fixup)._M_h);
  return;
}

Assistant:

void ParsedIR::fixup_reserved_names()
{
	for (uint32_t id : meta_needing_name_fixup)
	{
		auto &m = meta[id];
		sanitize_identifier(m.decoration.alias, false, false);
		for (auto &memb : m.members)
			sanitize_identifier(memb.alias, true, false);
	}
	meta_needing_name_fixup.clear();
}